

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

bool __thiscall llvm::yaml::Input::matchEnumScalar(Input *this,char *Str,bool param_2)

{
  HNode *pHVar1;
  Node *__n;
  _func_int **__s1;
  int iVar2;
  Node *pNVar3;
  
  if (this->ScalarMatchFound == false) {
    pHVar1 = this->CurrentNode;
    if (pHVar1 == (HNode *)0x0) {
      __assert_fail("Val && \"isa<> used on a null pointer\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Casting.h"
                    ,0x69,
                    "static bool llvm::isa_impl_cl<llvm::yaml::Input::ScalarHNode, const llvm::yaml::Input::HNode *>::doit(const From *) [To = llvm::yaml::Input::ScalarHNode, From = const llvm::yaml::Input::HNode *]"
                   );
    }
    if (0xfffffffd < pHVar1->_node->TypeID - 3) {
      __n = pHVar1[1]._node;
      if (Str == (char *)0x0) {
        if (__n == (Node *)0x0) goto LAB_00dac834;
      }
      else {
        __s1 = pHVar1[1]._vptr_HNode;
        pNVar3 = (Node *)strlen(Str);
        if ((__n == pNVar3) &&
           ((__n == (Node *)0x0 || (iVar2 = bcmp(__s1,Str,(size_t)__n), iVar2 == 0)))) {
LAB_00dac834:
          this->ScalarMatchFound = true;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Input::matchEnumScalar(const char *Str, bool) {
  if (ScalarMatchFound)
    return false;
  if (ScalarHNode *SN = dyn_cast<ScalarHNode>(CurrentNode)) {
    if (SN->value().equals(Str)) {
      ScalarMatchFound = true;
      return true;
    }
  }
  return false;
}